

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTest.c
# Opt level: O1

void Gia_ParTestSimulate2(Gia_Man_t *p,int nWords,int nProcs)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *__ptr;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined8 *__arg;
  uint *puVar9;
  ulong uVar10;
  pthread_t *__newthread;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  Par_ThData_t ThData [100];
  pthread_t WorkerThread [100];
  undefined8 local_998;
  uint local_990 [398];
  pthread_t local_358 [101];
  
  if (100 < nProcs) {
    __assert_fail("nProcs <= PAR_THR_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                  ,0xf2,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
  }
  uVar10 = (ulong)(uint)nProcs;
  Gia_ManRandom(1);
  if (p->pData != (void *)0x0) {
    __assert_fail("!p->pData",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                  ,0x30,"void Gia_ParTestAlloc(Gia_Man_t *, int)");
  }
  pvVar4 = malloc((long)p->nObjs * (long)nWords * 8);
  p->pData = pvVar4;
  p->iData = nWords;
  Gia_ParTestSimulateInit(p);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  lVar13 = (long)p->vCis->nSize;
  if (0 < lVar13) {
    do {
      if (p->vCis->nSize < lVar13) {
LAB_003b730d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,p->vCis->pArray[lVar13 + -1]);
      bVar2 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar2);
  }
  uVar12 = 0;
  Vec_IntPush(p_00,0);
  Gia_ManStaticFanoutStart(p);
  __ptr = Gia_ManCreateFaninCounts(p);
  iVar1 = __ptr->nSize;
  uVar11 = (ulong)iVar1;
  if (0 < (long)uVar11) {
    uVar8 = 0;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + __ptr->pArray[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  if (0 < nProcs) {
    __arg = &local_998;
    __newthread = local_358;
    uVar8 = uVar10;
    do {
      *__arg = p;
      __arg[1] = 0xffffffff;
      iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,Gia_ParWorkerThread,__arg);
      if (iVar3 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                      ,0x104,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
      }
      __arg = __arg + 2;
      __newthread = __newthread + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  do {
    do {
      if (((int)uVar12 < 1) && (p_00->nSize < 1)) {
        if (0 < iVar1) {
          piVar5 = __ptr->pArray;
          uVar8 = 0;
          do {
            if (piVar5[uVar8] != 0) {
              printf("%d -> %d    ",uVar8 & 0xffffffff);
              if ((long)p->nObjs <= (long)uVar8) {
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              Gia_ObjPrint(p,p->pObjs + uVar8);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar11);
        }
        do {
          uVar11 = 0;
          if (0 < nProcs) {
            uVar8 = 0;
            puVar9 = local_990 + 1;
            do {
              uVar11 = uVar8;
              if (*puVar9 != 0) break;
              uVar8 = uVar8 + 1;
              puVar9 = puVar9 + 4;
              uVar11 = uVar10;
            } while (uVar10 != uVar8);
          }
          if ((int)uVar11 == nProcs) {
            if (0 < nProcs) {
              lVar13 = 0;
              do {
                if (*(int *)((long)local_990 + lVar13 + 4) != 0) {
                  __assert_fail("ThData[i].Status == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                                ,0x132,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
                }
                *(undefined8 *)((long)local_990 + lVar13) = 0x1ffffffff;
                lVar13 = lVar13 + 0x10;
              } while (uVar10 * 0x10 != lVar13);
            }
            Gia_ManStaticFanoutStop(p);
            if (p_00->pArray != (int *)0x0) {
              free(p_00->pArray);
              p_00->pArray = (int *)0x0;
            }
            free(p_00);
            if (__ptr->pArray != (int *)0x0) {
              free(__ptr->pArray);
              __ptr->pArray = (int *)0x0;
            }
            if (__ptr != (Vec_Int_t *)0x0) {
              free(__ptr);
            }
            if (p->pData != (void *)0x0) {
              free(p->pData);
              p->pData = (void *)0x0;
            }
            p->iData = 0;
            return;
          }
        } while( true );
      }
    } while (nProcs < 1);
    uVar8 = 0;
    do {
      if (local_990[uVar8 * 4 + 1] == 0) {
        if (-1 < (int)local_990[uVar8 * 4]) {
          uVar6 = local_990[uVar8 * 4];
          if ((int)uVar6 < 0) goto LAB_003b730d;
          uVar14 = 0;
          while( true ) {
            if (p->vFanoutNums->nSize <= (int)uVar6) goto LAB_003b730d;
            if (p->vFanoutNums->pArray[uVar6] <= (int)uVar14) break;
            iVar3 = p->vFanout->nSize;
            if (iVar3 <= (int)uVar6) goto LAB_003b730d;
            piVar5 = p->vFanout->pArray;
            uVar6 = piVar5[uVar6] + uVar14;
            if (((int)uVar6 < 0) || (iVar3 <= (int)uVar6)) goto LAB_003b730d;
            iVar3 = piVar5[uVar6];
            lVar13 = (long)iVar3;
            if ((lVar13 < 0) || (iVar1 <= iVar3)) goto LAB_003b730d;
            iVar7 = __ptr->pArray[lVar13];
            if (iVar7 < 1) {
              __assert_fail("Vec_IntEntry(vFanins, iFan) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                            ,0x111,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
            }
            iVar7 = iVar7 + -1;
            __ptr->pArray[lVar13] = iVar7;
            if (iVar7 == 0) {
              Vec_IntPush(p_00,iVar3);
            }
            if ((~((int)uVar12 >> 0x1f) & uVar12) == uVar14) {
              __assert_fail("nCountFanins > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                            ,0x114,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
            }
            uVar14 = uVar14 + 1;
            uVar6 = local_990[uVar8 * 4];
            if ((int)uVar6 < 0) goto LAB_003b730d;
          }
          local_990[uVar8 * 4] = 0xffffffff;
          uVar12 = uVar12 - uVar14;
        }
        if (0 < p_00->nSize) {
          uVar6 = p_00->nSize - 1;
          p_00->nSize = uVar6;
          local_990[uVar8 * 4] = p_00->pArray[uVar6];
          local_990[uVar8 * 4 + 1] = 1;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar10);
  } while( true );
}

Assistant:

void Gia_ParTestSimulate2( Gia_Man_t * p, int nWords, int nProcs )
{
	pthread_t WorkerThread[PAR_THR_MAX];
    Par_ThData_t ThData[PAR_THR_MAX];
    Vec_Int_t * vStack, * vFanins;
    int i, k, iFan, status, nCountFanins;
    assert( nProcs <= PAR_THR_MAX );
    Gia_ManRandom( 1 );
    Gia_ParTestAlloc( p, nWords );
    Gia_ParTestSimulateInit( p );
    // start the stack
    vStack = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntryReverse( p->vCis, iFan, i )
        Vec_IntPush( vStack, iFan );
    Vec_IntPush( vStack, 0 );
    Gia_ManStaticFanoutStart( p );
    vFanins = Gia_ManCreateFaninCounts( p );
    nCountFanins = Vec_IntSum(vFanins);
    // start the threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].p = p;
        ThData[i].Id = -1;
        ThData[i].Status = 0;
        status = pthread_create( WorkerThread + i, NULL, Gia_ParWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    while ( nCountFanins > 0 || Vec_IntSize(vStack) > 0 )
    {
        for ( i = 0; i < nProcs; i++ )
        {
            if ( ThData[i].Status )
                continue;
            assert( ThData[i].Status == 0 );
            if ( ThData[i].Id >= 0 )
            {
                Gia_ObjForEachFanoutStaticId( p, ThData[i].Id, iFan, k )
                {
                    assert( Vec_IntEntry(vFanins, iFan) > 0 );
                    if ( Vec_IntAddToEntry(vFanins, iFan, -1) == 0 )
                        Vec_IntPush( vStack, iFan );
                    assert( nCountFanins > 0 );
                    nCountFanins--;
                }
                ThData[i].Id = -1;
            }
            if ( Vec_IntSize(vStack) > 0 )
            {
                ThData[i].Id = Vec_IntPop( vStack );
                ThData[i].Status = 1;
            }
        }
    }
    Vec_IntForEachEntry( vFanins, iFan, k )
        if ( iFan != 0 )
        {
            printf( "%d -> %d    ", k, iFan );
            Gia_ObjPrint( p, Gia_ManObj(p, k) );
        }
//    assert( Vec_IntSum(vFanins) == 0 );
    // stop the threads
    while ( 1 )
    {
        for ( i = 0; i < nProcs; i++ )
            if ( ThData[i].Status )
                break;
        if ( i == nProcs )
            break;
    }
    for ( i = 0; i < nProcs; i++ )
    {
        assert( ThData[i].Status == 0 );
        ThData[i].Id = -1;
        ThData[i].Status = 1;
    }
    Gia_ManStaticFanoutStop( p );
    Vec_IntFree( vStack );
    Vec_IntFree( vFanins );
//    Gia_ParComputeSignature( p, nWords ); printf( "   " );
    Gia_ParTestFree( p );
}